

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O3

void __thiscall
pbrt::SurfaceInteraction::SetIntersectionProperties
          (SurfaceInteraction *this,MaterialHandle *mtl,LightHandle *area,MediumInterface *mi,
          MediumHandle *med)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  type va;
  double vb;
  
  (this->material).
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = (mtl->
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          ).bits;
  (this->areaLight).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (area->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  fVar1 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar2 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar4 = ZEXT416((uint)(fVar1 * fVar2));
  auVar3 = vfmadd132ss_fma(ZEXT416((uint)(this->super_Interaction).n.
                                         super_Tuple3<pbrt::Normal3,_float>.y),auVar4,
                           ZEXT416((uint)(this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y));
  auVar4 = vfmsub213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar4);
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),
                           ZEXT416((uint)(this->super_Interaction).n.
                                         super_Tuple3<pbrt::Normal3,_float>.x),
                           ZEXT416((uint)(this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x));
  vb = 0.0;
  va = auVar3._0_4_;
  if (0.0 <= va) {
    if ((mi == (MediumInterface *)0x0) ||
       ((mi->inside).
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits == (mi->outside).
                 super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 .bits)) {
      (this->super_Interaction).medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (med->
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              ).bits;
    }
    else {
      (this->super_Interaction).mediumInterface = mi;
    }
    return;
  }
  LogFatal<char_const(&)[18],char_const(&)[3],char_const(&)[18],float&,char_const(&)[3],double&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/interaction.h"
             ,0xef,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [18])"Dot(n, shading.n)"
             ,(char (*) [3])0x500340,(char (*) [18])"Dot(n, shading.n)",&va,(char (*) [3])0x500340,
             &vb);
}

Assistant:

void SetIntersectionProperties(MaterialHandle mtl, LightHandle area,
                                   const MediumInterface *mi, MediumHandle med) {
        material = mtl;
        areaLight = area;
        CHECK_GE(Dot(n, shading.n), 0.);
        // Set medium properties at surface intersection
        if (mi && mi->IsMediumTransition())
            mediumInterface = mi;
        else
            medium = med;
    }